

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CMethod *stm)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  MethodInfo *this_00;
  element_type *peVar5;
  VariablesInfo *pVVar6;
  pointer pCVar7;
  element_type *peVar8;
  pointer pCVar9;
  pointer pCVar10;
  pointer pIVar11;
  shared_ptr<FullInfo> *psVar12;
  shared_ptr<VariablesInfo> local_78;
  shared_ptr<VariablesInfo> local_68;
  undefined1 local_55;
  shared_ptr<TypeInfo> local_48;
  shared_ptr<MethodInfo> local_38;
  shared_ptr<TypeInfo> local_28;
  CMethod *local_18;
  CMethod *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  psVar12 = &this->info;
  local_18 = stm;
  stm_local = (CMethod *)this;
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  std::__cxx11::string::operator=((string *)&peVar2->iName,"");
  pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->name);
  (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  std::shared_ptr<TypeInfo>::shared_ptr(&local_28,(nullptr_t)0x0);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  std::shared_ptr<TypeInfo>::operator=(&peVar2->iType,&local_28);
  std::shared_ptr<TypeInfo>::~shared_ptr(&local_28);
  pCVar4 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->(&local_18->returnType);
  (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  this_00 = (MethodInfo *)operator_new(0x58);
  local_55 = 1;
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  bVar1 = local_18->isPublic;
  peVar5 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  std::shared_ptr<TypeInfo>::shared_ptr(&local_48,&peVar5->iType);
  MethodInfo::MethodInfo(this_00,&peVar2->iName,(bool)(bVar1 & 1),&local_48);
  local_55 = 0;
  std::shared_ptr<MethodInfo>::shared_ptr<MethodInfo,void>(&local_38,this_00);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<MethodInfo>::operator=(&peVar2->iMethod,&local_38);
  std::shared_ptr<MethodInfo>::~shared_ptr(&local_38);
  std::shared_ptr<TypeInfo>::~shared_ptr(&local_48);
  pVVar6 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar6);
  std::shared_ptr<VariablesInfo>::shared_ptr<VariablesInfo,void>(&local_68,pVVar6);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<VariablesInfo>::operator=(&peVar2->iVariables,&local_68);
  std::shared_ptr<VariablesInfo>::~shared_ptr(&local_68);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->arguments);
  if (bVar1) {
    pCVar7 = std::unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_>::operator->
                       (&local_18->arguments);
    (**(pCVar7->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar7,this);
  }
  psVar12 = &this->info;
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  peVar5 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  peVar8 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &peVar5->iMethod);
  std::shared_ptr<VariablesInfo>::operator=(&peVar8->arguments,&peVar2->iVariables);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  peVar5 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      psVar12);
  std::shared_ptr<VariablesInfo>::operator=(&peVar5->definedVariables,&peVar2->iVariables);
  pVVar6 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar6);
  std::shared_ptr<VariablesInfo>::shared_ptr<VariablesInfo,void>(&local_78,pVVar6);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<VariablesInfo>::operator=(&peVar2->iVariables,&local_78);
  std::shared_ptr<VariablesInfo>::~shared_ptr(&local_78);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->vars);
  if (bVar1) {
    pCVar9 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->
                       (&local_18->vars);
    (**(pCVar9->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar9,this);
  }
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar5 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar8 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &peVar5->iMethod);
  std::shared_ptr<VariablesInfo>::operator=(&peVar8->fields,&peVar2->iVariables);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->statements);
  if (bVar1) {
    pCVar10 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator->
                        (&local_18->statements);
    (**(pCVar10->super_IStatement).super_PositionedNode.super_INode._vptr_INode)(pCVar10,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->returnExp);
  if (bVar1) {
    pIVar11 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                        (&local_18->returnExp);
    (**(pIVar11->super_PositionedNode).super_INode._vptr_INode)(pIVar11,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CMethod &stm )
{
//	std::cout << "method\n";
	info->iName = "";
	stm.name->Accept( *this );

	info->iType = nullptr;
	stm.returnType->Accept( *this );

	info->iMethod = std::shared_ptr<MethodInfo>( new MethodInfo( info->iName, stm.isPublic, info->iType ) );

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.arguments ) {
		stm.arguments->Accept( *this );
	}
    info->iMethod->arguments = info->iVariables;
    info->definedVariables = info->iVariables;
    info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.vars ) {
		stm.vars->Accept( *this );
	}
	info->iMethod->fields = info->iVariables;

	if( stm.statements ) {
		stm.statements->Accept( *this );
	}
	if( stm.returnExp ) {
		stm.returnExp->Accept( *this );
	}
}